

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_network_color_quantity.cpp
# Opt level: O1

void __thiscall
polyscope::CurveNetworkNodeColorQuantity::CurveNetworkNodeColorQuantity
          (CurveNetworkNodeColorQuantity *this,string *name,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *values_,CurveNetwork *network_)

{
  pointer pcVar1;
  string local_68;
  string local_48;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + name->_M_string_length);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"node","");
  CurveNetworkColorQuantity::CurveNetworkColorQuantity
            (&this->super_CurveNetworkColorQuantity,&local_48,network_,&local_68,values_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (this->super_CurveNetworkColorQuantity).super_CurveNetworkQuantity.
  super_QuantityS<polyscope::CurveNetwork>.super_Quantity._vptr_Quantity =
       (_func_int **)&PTR__CurveNetworkColorQuantity_005f8f90;
  return;
}

Assistant:

CurveNetworkNodeColorQuantity::CurveNetworkNodeColorQuantity(std::string name, std::vector<glm::vec3> values_,
                                                             CurveNetwork& network_)
    : CurveNetworkColorQuantity(name, network_, "node", values_) {}